

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

void __thiscall QLineEditPrivate::connectCompleter(QLineEditPrivate *this)

{
  Data *pDVar1;
  QObject *signal;
  QObject *signal_00;
  long in_FS_OFFSET;
  undefined1 local_40 [16];
  undefined8 uStack_30;
  Object local_28;
  
  local_28._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->control->m_completer).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    signal = (QObject *)0x0;
  }
  else {
    signal = (this->control->m_completer).wp.value;
  }
  local_40._8_8_ = QLineEdit::setText;
  uStack_30 = 0;
  signal_00 = (QObject *)0x0;
  QObject::connect<void(QCompleter::*)(QString_const&),void(QLineEdit::*)(QString_const&)>
            (&local_28,(offset_in_QCompleter_to_subr)signal,(ContextType *)QCompleter::activated,
             (offset_in_QLineEdit_to_subr *)0x0,
             (ConnectionType)*(undefined8 *)&(this->super_QWidgetPrivate).field_0x8);
  QMetaObject::Connection::~Connection((Connection *)&local_28);
  pDVar1 = (this->control->m_completer).wp.d;
  if (pDVar1 != (Data *)0x0) {
    if (*(int *)(pDVar1 + 4) == 0) {
      signal_00 = (QObject *)0x0;
    }
    else {
      signal_00 = (this->control->m_completer).wp.value;
    }
  }
  local_40._8_8_ = completionHighlighted;
  uStack_30 = 0;
  QObjectPrivate::
  connect<void(QCompleter::*)(QString_const&),void(QLineEditPrivate::*)(QString_const&)>
            ((Object *)local_40,(offset_in_QCompleter_to_subr)signal_00,
             (Object *)QCompleter::highlighted,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28._8_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::connectCompleter()
{
    Q_Q(const QLineEdit);
    QObject::connect(control->completer(), qOverload<const QString &>(&QCompleter::activated),
                     q, &QLineEdit::setText);
    QObjectPrivate::connect(control->completer(), qOverload<const QString &>(&QCompleter::highlighted),
                            this, &QLineEditPrivate::completionHighlighted);
}